

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> * chrono::Qdt_from_Wrel(ChVector<double> *w,ChQuaternion<double> *q)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChQuaternion<double> *result;
  ChQuaternion<double> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = w->m_data[0];
  dVar1 = q->m_data[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = q->m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = q->m_data[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = q->m_data[3];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = w->m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = w->m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = w->m_data[0] * dVar1;
  auVar2 = vfmsub231sd_fma(auVar8,auVar6,ZEXT816(0) << 0x40);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1 * 0.0;
  auVar8 = vfmadd231sd_fma(auVar12,auVar6,auVar3);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = q->m_data[2] * 0.0;
  auVar12 = vfmadd231sd_fma(auVar13,auVar6,auVar4);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = q->m_data[3] * 0.0;
  auVar6 = vfmadd231sd_fma(auVar9,auVar6,auVar5);
  auVar2 = vfnmadd231sd_fma(auVar2,auVar10,auVar4);
  auVar9 = vfnmadd231sd_fma(auVar8,auVar11,auVar4);
  auVar8 = vfmadd231sd_fma(auVar12,auVar11,auVar3);
  auVar6 = vfnmadd231sd_fma(auVar6,auVar10,auVar3);
  auVar12 = vfmadd231sd_fma(auVar9,auVar10,auVar5);
  auVar2 = vfnmadd231sd_fma(auVar2,auVar11,auVar5);
  auVar9 = vfnmadd231sd_fma(auVar8,auVar7,auVar5);
  auVar8 = vfmadd231sd_fma(auVar6,auVar7,auVar4);
  in_RDI->m_data[0] = auVar2._0_8_ * 0.5;
  in_RDI->m_data[1] = auVar12._0_8_ * 0.5;
  in_RDI->m_data[2] = auVar9._0_8_ * 0.5;
  in_RDI->m_data[3] = auVar8._0_8_ * 0.5;
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qdt_from_Wrel(const ChVector<double>& w, const ChQuaternion<double>& q) {
    ChQuaternion<double> qw;
    double half = 0.5;

    qw.e0() = 0;
    qw.e1() = w.x();
    qw.e2() = w.y();
    qw.e3() = w.z();

    return Qscale(Qcross(q, qw), half);  // {q_dt} = 1/2 {q}*{0,w_rel}
}